

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseBufferTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::BufferTextureStorageTestCase::initTestCaseGlobal(BufferTextureStorageTestCase *this)

{
  GLuint GVar1;
  GLenum GVar2;
  uchar *puVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  bool bVar9;
  
  GVar1 = SparseBufferTestUtilities::createComputeProgram(this->m_gl,&initTestCaseGlobal::cs_body,1)
  ;
  this->m_po = GVar1;
  uVar8 = this->m_to_width << 4;
  this->m_ssbo_zero_data_size = uVar8;
  puVar3 = (uchar *)operator_new__((ulong)uVar8);
  this->m_ssbo_zero_data = puVar3;
  uVar4 = 0;
  memset(puVar3,0,(ulong)uVar8);
  (*this->m_gl->genBuffers)(1,&this->m_ssbo);
  GVar2 = (*this->m_gl->getError)();
  glu::checkError(GVar2,"glGenBuffers() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x5c2);
  (*this->m_gl->bindBuffer)(0x90d2,this->m_ssbo);
  GVar2 = (*this->m_gl->getError)();
  glu::checkError(GVar2,"glBindBuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x5c5);
  (*this->m_gl->bufferData)(0x90d2,(ulong)this->m_ssbo_zero_data_size,this->m_ssbo_zero_data,0x88e4)
  ;
  GVar2 = (*this->m_gl->getError)();
  glu::checkError(GVar2,"glBufferData() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x5c8);
  (*this->m_gl->bindBufferBase)(0x90d2,0,this->m_ssbo);
  GVar2 = (*this->m_gl->getError)();
  glu::checkError(GVar2,"glBindBufferBase() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x5cc);
  uVar8 = this->m_to_width;
  this->m_helper_bo_data_size = uVar8 * 4;
  puVar3 = (uchar *)operator_new__((ulong)(uVar8 * 4));
  this->m_helper_bo_data = puVar3;
  uVar5 = 0x23;
  uVar6 = 0x4e;
  uVar7 = 0x83;
  while( true ) {
    bVar9 = uVar8 == 0;
    uVar8 = uVar8 - 1;
    if (bVar9) break;
    *puVar3 = (char)((ulong)uVar4 / 0xff) + (char)uVar4;
    puVar3[1] = (char)(uVar5 / 0xff) + (char)uVar5;
    puVar3[2] = (char)(uVar6 / 0xff) + (char)uVar6;
    puVar3[3] = (char)((ulong)uVar7 / 0xff) + (char)uVar7;
    uVar4 = uVar4 + 1;
    uVar5 = uVar5 + 1;
    uVar6 = uVar6 + 1;
    uVar7 = uVar7 + 1;
    puVar3 = puVar3 + 4;
  }
  (*this->m_gl->genBuffers)(1,&this->m_helper_bo);
  GVar2 = (*this->m_gl->getError)();
  glu::checkError(GVar2,"glGenBuffers() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x5f0);
  (*this->m_gl->bindBuffer)(0x8f36,this->m_helper_bo);
  GVar2 = (*this->m_gl->getError)();
  glu::checkError(GVar2,"glBindBuffer() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x5f3);
  (*this->m_gl->bufferData)(0x8f36,(ulong)this->m_helper_bo_data_size,this->m_helper_bo_data,0x88e4)
  ;
  GVar2 = (*this->m_gl->getError)();
  glu::checkError(GVar2,"glBufferData() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x5f6);
  (*this->m_gl->genTextures)(1,&this->m_to);
  GVar2 = (*this->m_gl->getError)();
  glu::checkError(GVar2,"glGenTextures() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x5fb);
  (*this->m_gl->bindTexture)(0x8c2a,this->m_to);
  GVar2 = (*this->m_gl->getError)();
  glu::checkError(GVar2,"glBindTexture() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseBufferTests.cpp"
                  ,0x5fe);
  uVar5 = this->m_page_size;
  uVar8 = this->m_to_width * 4;
  this->m_sparse_bo_size = uVar8;
  this->m_sparse_bo_size_rounded = (uVar5 - uVar8 % uVar5) % uVar5 + this->m_to_width * 4;
  return true;
}

Assistant:

bool BufferTextureStorageTestCase::initTestCaseGlobal()
{
	/* Set up the test program */
	static const char* cs_body =
		"#version 430 core\n"
		"\n"
		"layout(local_size_x = 1024) in;\n"
		"\n"
		"layout(std140, binding = 0) buffer data\n"
		"{\n"
		"    restrict writeonly int result[];\n"
		"};\n"
		"\n"
		"uniform samplerBuffer input_texture;\n"
		"\n"
		"void main()\n"
		"{\n"
		"    uint texel_index = gl_GlobalInvocationID.x;\n"
		"\n"
		"    if (texel_index < 65536)\n"
		"    {\n"
		"        vec4 expected_texel_data = vec4       (float((texel_index)       % 255) / 255.0,\n"
		"                                               float((texel_index + 35)  % 255) / 255.0,\n"
		"                                               float((texel_index + 78)  % 255) / 255.0,\n"
		"                                               float((texel_index + 131) % 255) / 255.0);\n"
		"        vec4 texel_data          = texelFetch(input_texture, int(texel_index) );\n"
		"\n"
		"        if (abs(texel_data.r - expected_texel_data.r) > 1.0 / 255.0 ||\n"
		"            abs(texel_data.g - expected_texel_data.g) > 1.0 / 255.0 ||\n"
		"            abs(texel_data.b - expected_texel_data.b) > 1.0 / 255.0 ||\n"
		"            abs(texel_data.a - expected_texel_data.a) > 1.0 / 255.0)\n"
		"        {\n"
		"            result[texel_index] = 0;\n"
		"        }\n"
		"        else\n"
		"        {\n"
		"            result[texel_index] = 1;\n"
		"        }\n"
		"    }\n"
		"}\n";

	m_po = SparseBufferTestUtilities::createComputeProgram(m_gl, &cs_body, 1); /* n_cs_body_parts */

	/* Set up a data buffer we will use to initialize the SSBO with default data.
	 *
	 * CS uses a std140 layout for the SSBO, so we need to add the additional padding.
	 */
	m_ssbo_zero_data_size = static_cast<unsigned int>(4 * sizeof(int) * m_to_width);
	m_ssbo_zero_data	  = new unsigned char[m_ssbo_zero_data_size];

	memset(m_ssbo_zero_data, 0, m_ssbo_zero_data_size);

	/* Set up the SSBO */
	m_gl.genBuffers(1, &m_ssbo);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGenBuffers() call failed.");

	m_gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, m_ssbo);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBuffer() call failed.");

	m_gl.bufferData(GL_SHADER_STORAGE_BUFFER, m_ssbo_zero_data_size, m_ssbo_zero_data, GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferData() call failed.");

	m_gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, /* index */
						m_ssbo);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBufferBase() call failed.");

	/* During execution, we will need to use a helper buffer object. The BO will hold
	 * data we will be copying into the sparse buffer object for each iteration.
	 *
	 * Create an array to hold the helper buffer's data and fill it with info that
	 * the compute shader is going to be expecting */
	unsigned char* helper_bo_data_traveller_ptr = NULL;

	m_helper_bo_data_size = m_to_width * 4; /* rgba */
	m_helper_bo_data	  = new unsigned char[m_helper_bo_data_size];

	helper_bo_data_traveller_ptr = m_helper_bo_data;

	for (unsigned int n_texel = 0; n_texel < m_to_width; ++n_texel)
	{
		/* Red */
		*helper_bo_data_traveller_ptr = static_cast<unsigned char>(n_texel % 255);
		++helper_bo_data_traveller_ptr;

		/* Green */
		*helper_bo_data_traveller_ptr = static_cast<unsigned char>((n_texel + 35) % 255);
		++helper_bo_data_traveller_ptr;

		/* Blue */
		*helper_bo_data_traveller_ptr = static_cast<unsigned char>((n_texel + 78) % 255);
		++helper_bo_data_traveller_ptr;

		/* Alpha */
		*helper_bo_data_traveller_ptr = static_cast<unsigned char>((n_texel + 131) % 255);
		++helper_bo_data_traveller_ptr;
	} /* for (all texels to be accessible via the buffer texture) */

	/* Set up the helper buffer object which we are going to use to copy data into
	 * the sparse buffer object. */
	m_gl.genBuffers(1, &m_helper_bo);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGenBuffers() call failed.");

	m_gl.bindBuffer(GL_COPY_READ_BUFFER, m_helper_bo);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindBuffer() call failed.");

	m_gl.bufferData(GL_COPY_READ_BUFFER, m_helper_bo_data_size, m_helper_bo_data, GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBufferData() call failed.");

	/* Set up the texture buffer object. We will attach the actual buffer storage
	 * in execute() */
	m_gl.genTextures(1, &m_to);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glGenTextures() call failed.");

	m_gl.bindTexture(GL_TEXTURE_BUFFER, m_to);
	GLU_EXPECT_NO_ERROR(m_gl.getError(), "glBindTexture() call failed.");

	/* Determine the number of bytes both the helper and the sparse buffer
	 * object need to be able to hold, at maximum */
	m_sparse_bo_size		 = static_cast<unsigned int>(m_to_width * sizeof(int));
	m_sparse_bo_size_rounded = SparseBufferTestUtilities::alignOffset(m_sparse_bo_size, m_page_size);

	return true;
}